

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::MinutesOperator>>
               (date_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ulong uVar3;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  idx_t idx_in_entry_1;
  ulong uVar10;
  idx_t idx_in_entry;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  idx_t local_80;
  date_t *local_78;
  long *local_70;
  ValidityMask *local_68;
  ulong local_60;
  buffer_ptr<ValidityBuffer> *local_58;
  idx_t local_50;
  ulong local_48;
  date_t *local_40;
  long *local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_68 = mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar11 = 0;
      do {
        bVar7 = Value::IsFinite<duckdb::date_t>((date_t)ldata[uVar11].days);
        if (!bVar7) {
          _Var9._M_head_impl =
               (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var9._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var6 = p_Stack_90;
            peVar5 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(result_mask->super_TemplatedValidityMask<unsigned_long>).
                                 validity_data);
            _Var9._M_head_impl =
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 _Var9._M_head_impl;
          }
          bVar4 = (byte)uVar11 & 0x3f;
          _Var9._M_head_impl[uVar11 >> 6] =
               _Var9._M_head_impl[uVar11 >> 6] &
               (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        }
        result_data[uVar11] = 0;
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_80 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_98,(unsigned_long **)mask,&local_80);
      p_Var6 = p_Stack_90;
      peVar5 = local_98;
      local_98 = (element_type *)0x0;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar5;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var6;
      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
         p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_60 = count + 0x3f >> 6;
      local_58 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      local_48 = 0;
      uVar11 = 0;
      local_78 = ldata;
      local_70 = result_data;
      local_50 = count;
      do {
        puVar1 = (local_68->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar10 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar10 = count;
          }
LAB_00f74399:
          uVar12 = uVar11;
          if (uVar11 < uVar10) {
            do {
              bVar7 = Value::IsFinite<duckdb::date_t>((date_t)ldata[uVar11].days);
              if (!bVar7) {
                _Var9._M_head_impl =
                     (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (_Var9._M_head_impl == (unsigned_long *)0x0) {
                  local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_98,&local_80);
                  p_Var6 = p_Stack_90;
                  peVar5 = local_98;
                  local_98 = (element_type *)0x0;
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                           internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar5;
                  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var6;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->(local_58);
                  _Var9._M_head_impl =
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       _Var9._M_head_impl;
                }
                bVar4 = (byte)uVar11 & 0x3f;
                _Var9._M_head_impl[uVar11 >> 6] =
                     _Var9._M_head_impl[uVar11 >> 6] &
                     (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              }
              result_data[uVar11] = 0;
              uVar11 = uVar11 + 1;
              uVar12 = uVar10;
            } while (uVar10 != uVar11);
          }
        }
        else {
          uVar3 = puVar1[local_48];
          uVar10 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar10 = count;
          }
          uVar12 = uVar10;
          ldata = local_78;
          if (uVar3 != 0) {
            if (uVar3 == 0xffffffffffffffff) goto LAB_00f74399;
            result_data = local_70;
            uVar12 = uVar11;
            if (uVar11 < uVar10) {
              local_38 = local_70 + uVar11;
              local_40 = local_78 + uVar11;
              uVar13 = 0;
              do {
                if ((uVar3 >> (uVar13 & 0x3f) & 1) != 0) {
                  bVar7 = Value::IsFinite<duckdb::date_t>((date_t)local_40[uVar13].days);
                  if (!bVar7) {
                    _Var9._M_head_impl =
                         (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                    if (_Var9._M_head_impl == (unsigned_long *)0x0) {
                      local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)&local_98,&local_80);
                      p_Var6 = p_Stack_90;
                      peVar5 = local_98;
                      local_98 = (element_type *)0x0;
                      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).
                               validity_data.internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = peVar5;
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = p_Var6;
                      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                         p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                      }
                      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                               operator->(local_58);
                      _Var9._M_head_impl =
                           (pTVar8->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                           _Var9._M_head_impl;
                    }
                    bVar4 = (byte)(uVar13 + uVar11) & 0x3f;
                    _Var9._M_head_impl[uVar13 + uVar11 >> 6] =
                         _Var9._M_head_impl[uVar13 + uVar11 >> 6] &
                         (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                  }
                  local_38[uVar13] = 0;
                }
                uVar13 = uVar13 + 1;
                result_data = local_70;
                uVar12 = uVar10;
                count = local_50;
                ldata = local_78;
              } while (uVar10 - uVar11 != uVar13);
            }
          }
        }
        local_48 = local_48 + 1;
        uVar11 = uVar12;
      } while (local_48 != local_60);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}